

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O3

void __thiscall Grid::setup_neighbours(Grid *this)

{
  pointer *pppGVar1;
  GridNode *pGVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  int local_60;
  GridNode *local_38;
  
  iVar5 = this->rows;
  if (0 < iVar5) {
    iVar4 = this->columns;
    iVar12 = 0;
    local_60 = 1;
    do {
      if (0 < iVar4) {
        iVar5 = 1;
        if (1 < iVar12) {
          iVar5 = iVar12;
        }
        iVar9 = 0;
        do {
          iVar7 = 1;
          if (1 < iVar9) {
            iVar7 = iVar9;
          }
          iVar10 = iVar9 + 1;
          iVar11 = iVar4 + -1;
          if (iVar10 < iVar4 + -1) {
            iVar11 = iVar10;
          }
          iVar8 = this->rows + -1;
          iVar3 = iVar5 + -1;
          if (this->rows < iVar12) {
            iVar3 = iVar8;
          }
          iVar6 = iVar8;
          if (iVar12 + 1 < iVar8) {
            iVar6 = iVar12 + 1;
          }
          if (iVar3 <= iVar6) {
            pGVar2 = this->nodes;
            iVar4 = iVar4 * iVar12 + iVar9;
            if (local_60 < iVar8) {
              iVar8 = local_60;
            }
            do {
              iVar6 = iVar7 + -1;
              if (iVar7 + -1 <= iVar11) {
                do {
                  if (iVar9 != iVar6 || iVar3 != iVar12) {
                    local_38 = this->nodes + (this->columns * iVar3 + iVar6);
                    __position._M_current =
                         pGVar2[iVar4].neighbours.
                         super__Vector_base<GridNode_*,_std::allocator<GridNode_*>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        pGVar2[iVar4].neighbours.
                        super__Vector_base<GridNode_*,_std::allocator<GridNode_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<GridNode*,std::allocator<GridNode*>>::_M_realloc_insert<GridNode*>
                                ((vector<GridNode*,std::allocator<GridNode*>> *)
                                 &pGVar2[iVar4].neighbours,__position,&local_38);
                    }
                    else {
                      *__position._M_current = local_38;
                      pppGVar1 = &pGVar2[iVar4].neighbours.
                                  super__Vector_base<GridNode_*,_std::allocator<GridNode_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish;
                      *pppGVar1 = *pppGVar1 + 1;
                    }
                    pGVar2[iVar4].neighbourCount = pGVar2[iVar4].neighbourCount + 1;
                  }
                  bVar13 = iVar6 < iVar11;
                  iVar6 = iVar6 + 1;
                } while (bVar13);
              }
              bVar13 = iVar3 != iVar8;
              iVar3 = iVar3 + 1;
            } while (bVar13);
            iVar4 = this->columns;
          }
          iVar9 = iVar10;
        } while (iVar10 < iVar4);
        iVar5 = this->rows;
      }
      iVar12 = iVar12 + 1;
      local_60 = local_60 + 1;
    } while (iVar12 < iVar5);
  }
  return;
}

Assistant:

void setup_neighbours()
    {
        for (int y = 0; y < rows; y++)
        {
            for (int x = 0; x < columns; x++)
            {
                GridNode *node = get_node_from_position(x, y);
                int startX = clamp(x - 1, 0, columns - 1);
                int endX = clamp(x + 1, 0, columns - 1);
                int startY = clamp(y - 1, 0, rows - 1);
                int endY = clamp(y + 1, 0, rows - 1);
                for (int newY = startY; newY <= endY; newY++)
                {
                    for (int newX = startX; newX <= endX; newX++)
                    {

                        if (newX != x || newY != y)
                        {
#if DIAGONAL_DISABLED
                            if (newX == x || newY == y)
                            {
                                node->neighbours.push_back(get_node_from_position(newX, newY));
                                node->neighbourCount++;
                            }
#else
                            node->neighbours.push_back(get_node_from_position(newX, newY));
                            node->neighbourCount++;
#endif
                        }
                    }
                }
            }
        }
    }